

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O3

void place_gold(chunk_conflict *c,loc_conflict grid,wchar_t level,uint8_t origin)

{
  _Bool _Var1;
  uint8_t uVar2;
  object *drop;
  _Bool dummy;
  _Bool local_31;
  object *local_30;
  
  local_31 = true;
  _Var1 = square_in_bounds(c,(loc)grid);
  if (_Var1) {
    _Var1 = square_canputitem(c,(loc)grid);
    if (_Var1) {
      drop = make_gold(level,"any");
      drop->origin = origin;
      local_30 = drop;
      uVar2 = convert_depth_to_origin(level);
      drop->origin_depth = uVar2;
      _Var1 = floor_carry((chunk *)c,(loc)grid,drop,&local_31);
      if (_Var1) {
        list_object(c,drop);
      }
      else {
        object_delete((chunk *)c,(chunk *)0x0,&local_30);
      }
    }
  }
  return;
}

Assistant:

void place_gold(struct chunk *c, struct loc grid, int level, uint8_t origin)
{
	struct object *money = NULL;
	bool dummy = true;

	if (!square_in_bounds(c, grid)) return;
	if (!square_canputitem(c, grid)) return;

	money = make_gold(level, "any");
	money->origin = origin;
	money->origin_depth = convert_depth_to_origin(level);

	if (!floor_carry(c, grid, money, &dummy)) {
		object_delete(c, NULL, &money);
	} else {
		list_object(c, money);
	}
}